

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_Next_NEXTREG(void)

{
  byte bVar1;
  bool bVar2;
  Z80Reg ZVar3;
  ulong uVar4;
  int local_28 [2];
  int e [5];
  Z80Reg reg;
  
  if (DAT_001e16a8._4_4_ < 1) {
    Error("Z80N instructions are currently disabled",bp,SUPPRESS);
  }
  else {
    do {
      e[2] = -1;
      e[1] = -1;
      e[0] = -1;
      local_28[1] = 0xffffffff;
      local_28[0] = -1;
      ZVar3 = GetRegister(&::lp);
      if (ZVar3 != Z80_UNK) {
        Error("[NEXTREG] first operand should be register number",::line,SUPPRESS);
        return;
      }
      bVar1 = GetByteNoMem(&::lp,false);
      e[0] = (int)bVar1;
      Relocation::checkAndWarn(false);
      bVar2 = comma(&::lp);
      if (!bVar2) {
        Error("[NEXTREG] Comma expected",(char *)0x0,PASS3);
        return;
      }
      ZVar3 = GetRegister(&::lp);
      if (ZVar3 == Z80_UNK) {
        local_28[0] = 0xed;
        local_28[1] = 0x91;
        bVar1 = GetByteNoMem(&::lp,false);
        e[1] = (int)bVar1;
        resolveRelocationAndSmartSmc(3,HIGH);
      }
      else if (ZVar3 == Z80_A) {
        local_28[0] = 0xed;
        local_28[1] = 0x92;
      }
      EmitBytes(local_28,true);
      uVar4 = (*DAT_001e16b0)(&::lp);
    } while ((uVar4 & 1) != 0);
  }
  return;
}

Assistant:

static void OpCode_Next_NEXTREG() {
		if (Options::syx.IsNextEnabled < 1) {
			Error("Z80N instructions are currently disabled", bp, SUPPRESS);
			return;
		}
		Z80Reg reg;
		int e[5];
		do {
			e[0] = e[1] = e[2] = e[3] = e[4] = -1;
			// is operand1 register? (to give more precise error message to people using wrong `nextreg a,$nn`)
			reg = GetRegister(lp);
			if (Z80_UNK != reg) {
				Error("[NEXTREG] first operand should be register number", line, SUPPRESS); break;
			}
			// this code would be enough to get correct assembling, the test above is "extra"
			e[2] = GetByteNoMem(lp);
			Relocation::checkAndWarn();		// display warning if register number is trying to be relocatable (impossible)
			if (!comma(lp)) {
				Error("[NEXTREG] Comma expected"); break;
			}
			switch (reg = GetRegister(lp)) {
				case Z80_A:
					e[0] = 0xED; e[1] = 0x92;
					break;
				case Z80_UNK:
					e[0] = 0xED; e[1] = 0x91;
					e[3] = GetByteNoMem(lp);
					resolveRelocationAndSmartSmc(3, Relocation::HIGH);
					break;
				default:
					break;
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}